

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v8::detail::
    get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
              (void)

{
  char *message;
  int iStack0000000000000008;
  long arg;
  undefined4 in_stack_00000018;
  error_handler local_9;
  
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 = (ulong)iStack0000000000000008;
    goto LAB_00128da2;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    break;
  case 3:
LAB_00128da2:
    if ((long)_iStack0000000000000008 < 0) {
LAB_00128da7:
      message = "negative width";
      goto LAB_00128dd1;
    }
    break;
  case 4:
  case 6:
switchD_00128d8c_caseD_4:
    break;
  case 5:
    if (-1 < arg) goto switchD_00128d8c_caseD_4;
    goto LAB_00128da7;
  default:
    message = "width is not integer";
    goto LAB_00128dd1;
  }
  if (_iStack0000000000000008 >> 0x1f == 0) {
    return (int)_iStack0000000000000008;
  }
  message = "number is too big";
LAB_00128dd1:
  error_handler::on_error(&local_9,message);
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}